

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_C2S_UDP_DATA_check(void)

{
  int32_t iVar1;
  uint8_t buf4 [5];
  uint8_t buf3 [28];
  PipeMsg msg;
  uint8_t buf6 [29];
  uint8_t buf5 [29];
  uint8_t buf2 [30];
  uint8_t buf1 [30];
  uint8_t local_1d0 [8];
  uint8_t local_1c8 [32];
  PipeMsg local_1a8;
  uint8_t local_88 [32];
  uint8_t local_68 [32];
  uint8_t local_48 [32];
  uint8_t local_28 [32];
  
  MsgHelper::initMsg(&local_1a8,C2S_UDP_DATA);
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\x01';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = 0xff;
  local_28[0x18] = 0xff;
  local_28[0x19] = '\x01';
  local_28[0x1a] = '\x02';
  local_28[0x1b] = '\x03';
  local_28[0x1c] = '\x04';
  local_28[0x1d] = '\x05';
  local_28[0] = '\x04';
  local_28[1] = '\x02';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\r';
  local_28[6] = '\x04';
  local_28[7] = 0xfe;
  local_28[8] = 0x80;
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  iVar1 = MsgHelper::deserializeMsg(local_28,0x1e,&local_1a8);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x14e,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_1a8);
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\x01';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = 0xff;
  local_48[0x18] = 0xff;
  local_48[0x19] = '\x01';
  local_48[0x1a] = '\x02';
  local_48[0x1b] = '\x03';
  local_48[0x1c] = '\x04';
  local_48[0x1d] = '\x05';
  local_48[0] = '\x04';
  local_48[1] = '\x02';
  local_48[2] = '\x01';
  local_48[3] = '\x02';
  local_48[4] = '\x03';
  local_48[5] = '\x04';
  local_48[6] = '\x04';
  local_48[7] = 0xfe;
  local_48[8] = 0x80;
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  iVar1 = MsgHelper::deserializeMsg(local_48,0x1e,&local_1a8);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x153,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_1a8);
  local_1c8[0x10] = 'u';
  local_1c8[0x11] = '.';
  local_1c8[0x12] = 'c';
  local_1c8[0x13] = 'o';
  local_1c8[0x14] = 'm';
  local_1c8[0x15] = 0xff;
  local_1c8[0x16] = 0xff;
  local_1c8[0x17] = '\x01';
  local_1c8[0x18] = '\x02';
  local_1c8[0x19] = '\x03';
  local_1c8[0x1a] = '\x04';
  local_1c8[0x1b] = '\x05';
  local_1c8[0] = '\x04';
  local_1c8[1] = '\x02';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\x1c';
  local_1c8[6] = '\x03';
  local_1c8[7] = '\0';
  local_1c8[8] = 'w';
  local_1c8[9] = 'w';
  local_1c8[10] = 'w';
  local_1c8[0xb] = '.';
  local_1c8[0xc] = 'b';
  local_1c8[0xd] = 'a';
  local_1c8[0xe] = 'i';
  local_1c8[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(local_1c8,0x1c,&local_1a8);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x158,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_1a8);
  builtin_memcpy(local_1d0,"\x04\x02\x03\x03\x03",5);
  iVar1 = MsgHelper::deserializeMsg(local_1d0,5,&local_1a8);
  if (iVar1 != 0) {
    __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x15c,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_1a8);
  local_68[0x10] = 'u';
  local_68[0x11] = '.';
  local_68[0x12] = 'c';
  local_68[0x13] = 'o';
  local_68[0x14] = 'm';
  local_68[0x15] = 0xff;
  local_68[0x16] = 0xff;
  local_68[0x17] = '\x01';
  local_68[0x18] = '\x02';
  local_68[0x19] = '\x03';
  local_68[0x1a] = '\x04';
  local_68[0x1b] = '\x05';
  local_68[0x1c] = 0xee;
  local_68[0] = '\x04';
  local_68[1] = '\x02';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\x1c';
  local_68[6] = '\x03';
  local_68[7] = '\r';
  local_68[8] = 'w';
  local_68[9] = 'w';
  local_68[10] = 'w';
  local_68[0xb] = '.';
  local_68[0xc] = 'b';
  local_68[0xd] = 'a';
  local_68[0xe] = 'i';
  local_68[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(local_68,0x1d,&local_1a8);
  if (iVar1 != 0x1c) {
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x160,"void test_C2S_UDP_DATA_check()");
  }
  if (CONCAT62(local_1a8.field_1._28_6_,local_1a8.field_1._26_2_) != 0x6d6f632e756469 ||
      CONCAT26(local_1a8.field_1._26_2_,local_1a8.field_1._20_6_) != 0x646961622e777777) {
    __assert_fail("strcmp(\"www.baidu.com\", msg.common_udp_data.ADDR.ADDR) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x161,"void test_C2S_UDP_DATA_check()");
  }
  if (local_1a8.field_1.common_udp_data.ADDR.PORT != 0xffff) {
    __assert_fail("msg.common_udp_data.ADDR.PORT == 65535",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x162,"void test_C2S_UDP_DATA_check()");
  }
  MsgHelper::destroyMsg(&local_1a8);
  local_88[0x10] = 'u';
  local_88[0x11] = '.';
  local_88[0x12] = 'c';
  local_88[0x13] = 'o';
  local_88[0x14] = 'm';
  local_88[0x15] = 0xff;
  local_88[0x16] = 0xff;
  local_88[0x17] = '\x01';
  local_88[0x18] = '\x02';
  local_88[0x19] = '\x03';
  local_88[0x1a] = '\x04';
  local_88[0x1b] = '\x05';
  local_88[0x1c] = 0xee;
  local_88[0] = '\x04';
  local_88[1] = '\x02';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\x17';
  local_88[6] = '\x03';
  local_88[7] = '\r';
  local_88[8] = 'w';
  local_88[9] = 'w';
  local_88[10] = 'w';
  local_88[0xb] = '.';
  local_88[0xc] = 'b';
  local_88[0xd] = 'a';
  local_88[0xe] = 'i';
  local_88[0xf] = 'd';
  iVar1 = MsgHelper::deserializeMsg(local_88,0x1d,&local_1a8);
  if (iVar1 == -1) {
    MsgHelper::destroyMsg(&local_1a8);
    return;
  }
  __assert_fail("MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x168,"void test_C2S_UDP_DATA_check()");
}

Assistant:

void test_C2S_UDP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::C2S_UDP_DATA);
	
	// error: len(0x0d) < min
	const uint8_t buf1[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x0D, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x01020301) overflow
	const uint8_t buf2[] = {0x04, 0x02, 0x01, 0x02, 0x03, 0x04, 0x04, 0xFE, 0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: domain len(0x00)
	const uint8_t buf3[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x00, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x04, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
		
	const uint8_t buf5[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x1C, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == 28);
	assert(strcmp("www.baidu.com", msg.common_udp_data.ADDR.ADDR) == 0);
	assert(msg.common_udp_data.ADDR.PORT == 65535);
	
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x17) < min
	const uint8_t buf6[] = {0x04, 0x02, 0x00, 0x00, 0x00, 0x17, 0x03, 0x0D, 0x77, 0x77, 0x77, 0x2E, 0x62, 0x61, 0x69, 0x64, 0x75, 0x2E, 0x63, 0x6F, 0x6D, 0xFF, 0xFF, 0x01, 0x02, 0x03, 0x04, 0x05, 0xEE};
	assert(MsgHelper::deserializeMsg(buf6, sizeof(buf6), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}